

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<capnp::Type> * __thiscall
capnp::compiler::Compiler::Node::resolveBootstrapType
          (Maybe<capnp::Type> *__return_storage_ptr__,Node *this,Reader type,Schema scope)

{
  Module *pMVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  Exception *params_1;
  char *pcVar5;
  RawBrandedSchema *local_310;
  Maybe<kj::Exception> local_308;
  Runnable local_1a0;
  Maybe<capnp::Type> *local_198;
  Node *local_190;
  Exception *local_188;
  RawBrandedSchema **local_180;
  char local_178;
  Exception local_170;
  
  local_180 = &local_310;
  (__return_storage_ptr__->ptr).isSet = false;
  local_1a0._vptr_Runnable = (_func_int **)&PTR_run_002bd320;
  params_1 = (Exception *)&type;
  local_310 = scope.raw;
  local_198 = __return_storage_ptr__;
  local_190 = this;
  local_188 = params_1;
  kj::_::runCatchingExceptions(&local_308,&local_1a0);
  local_178 = local_308.ptr.isSet;
  if (local_308.ptr.isSet != false) {
    local_170.ownFile.content.ptr = local_308.ptr.field_1.value.ownFile.content.ptr;
    local_170.ownFile.content.size_ = local_308.ptr.field_1.value.ownFile.content.size_;
    local_170.ownFile.content.disposer = local_308.ptr.field_1.value.ownFile.content.disposer;
    local_308.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_308.ptr.field_1.value.ownFile.content.size_ = 0;
    local_170.file = local_308.ptr.field_1.value.file;
    local_170.line = local_308.ptr.field_1.value.line;
    local_170.type = local_308.ptr.field_1.value.type;
    local_170.description.content.ptr = local_308.ptr.field_1.value.description.content.ptr;
    local_170.description.content.size_ = local_308.ptr.field_1.value.description.content.size_;
    local_308.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_308.ptr.field_1.value.description.content.size_ = 0;
    local_170.description.content.disposer =
         local_308.ptr.field_1.value.description.content.disposer;
    local_170.context.ptr.disposer = local_308.ptr.field_1.value.context.ptr.disposer;
    local_170.context.ptr.ptr = local_308.ptr.field_1.value.context.ptr.ptr;
    local_308.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_170.trace,(undefined1 *)((long)&local_308.ptr.field_1.value + 0x50),0x104);
    kj::Exception::~Exception((Exception *)&local_308.ptr.field_1);
    if ((__return_storage_ptr__->ptr).isSet == true) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    iVar4 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
    if ((char)iVar4 == '\0') {
      kj::str<char_const(&)[57],kj::Exception&>
                ((String *)&local_308,
                 (kj *)"Internal compiler bug: Bootstrap schema failed to load:\n",
                 (char (*) [57])&local_170,params_1);
      pcVar5 = (char *)local_308.ptr._0_8_;
      if (local_308.ptr.field_1.value.ownFile.content.ptr == (char *)0x0) {
        pcVar5 = "";
      }
      pMVar1 = this->module->parserModule;
      (**(pMVar1->super_ErrorReporter)._vptr_ErrorReporter)
                (pMVar1,(ulong)this->startByte,(ulong)this->endByte,pcVar5,
                 local_308.ptr.field_1.value.ownFile.content.ptr +
                 (local_308.ptr.field_1.value.ownFile.content.ptr == (char *)0x0));
      uVar3 = local_308.ptr.field_1.value.ownFile.content.ptr;
      uVar2 = local_308.ptr._0_8_;
      if ((char *)local_308.ptr._0_8_ != (char *)0x0) {
        local_308.ptr._0_8_ = (char *)0x0;
        local_308.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)local_308.ptr.field_1.value.ownFile.content.size_)
                  (local_308.ptr.field_1.value.ownFile.content.size_,uVar2,1,uVar3,uVar3,0);
      }
    }
  }
  if (local_178 == '\x01') {
    kj::Exception::~Exception(&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Type> Compiler::Node::resolveBootstrapType(schema::Type::Reader type, Schema scope) {
  // TODO(someday): Arguably should return null if the type or its dependencies are placeholders.

  kj::Maybe<Type> result;
  KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&]() {
    result = module->getCompiler().getWorkspace().bootstrapLoader.getType(type, scope);
  })) {
    result = nullptr;
    if (!module->getErrorReporter().hadErrors()) {
      addError(kj::str("Internal compiler bug: Bootstrap schema failed to load:\n",
                       *exception));
    }
  }
  return result;
}